

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O0

void __thiscall UKF::SetInitialValues(UKF *this,MeasurementPackage *meas_package)

{
  float fVar1;
  float fVar2;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar3;
  CoeffReturnType pdVar4;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar5;
  VectorXd *this_00;
  double dVar6;
  Scalar local_1d0;
  Scalar local_1c8;
  Scalar local_1c0;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1b8;
  Scalar local_198;
  Scalar local_190;
  double local_188;
  double local_180;
  double local_178;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_170;
  float local_14c;
  float local_148;
  float vy;
  float vx;
  float py;
  float px;
  float rhodot;
  float phi;
  float rho;
  Scalar local_128;
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_68;
  int local_38 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_30;
  MeasurementPackage *local_18;
  MeasurementPackage *meas_package_local;
  UKF *this_local;
  
  local_38[1] = 5;
  local_38[0] = 5;
  local_18 = meas_package;
  meas_package_local = (MeasurementPackage *)this;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_30,local_38 + 1,local_38);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->P_,&local_30);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_30);
  local_70 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_68,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->P_,&local_70);
  local_78 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_68,&local_78);
  local_80 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_80);
  local_88 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_88);
  local_90 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_90);
  local_98 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_98);
  local_a0 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_a0);
  local_a8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_a8);
  local_b0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_b0);
  local_b8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_b8);
  local_c0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_c0);
  local_c8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_c8);
  local_d0 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_d0);
  local_d8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_d8);
  local_e0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_e0);
  local_e8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_e8);
  local_f0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_f0);
  local_f8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_f8);
  local_100 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_100);
  local_108 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_108);
  local_110 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_110);
  local_118 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_118);
  local_120 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_120);
  local_128 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_128);
  _phi = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar3,(Scalar *)&phi);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_68);
  if (meas_package->sensor_type_ == RADAR) {
    this_00 = &meas_package->raw_measurements_;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_00,0);
    rhodot = (float)*pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_00,1);
    px = (float)*pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_00,2);
    fVar1 = rhodot;
    py = (float)*pdVar4;
    dVar6 = std::cos((double)(ulong)(uint)px);
    fVar2 = rhodot;
    vx = fVar1 * SUB84(dVar6,0);
    dVar6 = std::sin((double)(ulong)(uint)px);
    fVar1 = py;
    vy = fVar2 * SUB84(dVar6,0);
    dVar6 = std::cos((double)(ulong)(uint)px);
    fVar2 = py;
    local_148 = fVar1 * SUB84(dVar6,0);
    dVar6 = std::sin((double)(ulong)(uint)px);
    local_14c = fVar2 * SUB84(dVar6,0);
    local_178 = (double)vx;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_170,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_,&local_178
              );
    local_180 = (double)vy;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (&local_170,&local_180);
    dVar6 = std::sqrt((double)(ulong)(uint)(local_148 * local_148 + local_14c * local_14c));
    local_188 = (double)SUB84(dVar6,0);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar5,&local_188);
    local_190 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar5,&local_190);
    local_198 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar5,&local_198);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_170);
  }
  else if (meas_package->sensor_type_ == LASER) {
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &meas_package->raw_measurements_,0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_1b8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_,pdVar4);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &meas_package->raw_measurements_,1);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (&local_1b8,pdVar4);
    local_1c0 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar5,&local_1c0);
    local_1c8 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar5,&local_1c8);
    local_1d0 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar5,&local_1d0);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_1b8);
  }
  return;
}

Assistant:

void UKF::SetInitialValues(const MeasurementPackage meas_package) {

  // initialize state covariance matrix P 
  P_ = MatrixXd(5, 5);
  P_ <<   1, 0,  0,  0,  0,
          0,  1, 0,  0,  0,
          0,  0,  1, 0,  0,
          0,  0,  0,  1, 0,
          0,  0,  0,  0,  1;

  if (meas_package.sensor_type_ == MeasurementPackage::RADAR) {
    
    // Convert radar from polar to cartesian coordinates and initialize state.
    float rho = meas_package.raw_measurements_(0);
    float phi = meas_package.raw_measurements_(1);
    float rhodot = meas_package.raw_measurements_(2);

    float px = rho * cos(phi);
    float py = rho * sin(phi);
    float vx = rhodot * cos(phi);
    float vy = rhodot * sin(phi);

    x_ << px,py,sqrt(vx*vx +vy*vy),0,0;

  } 

  else if (meas_package.sensor_type_ == MeasurementPackage::LASER) {

    // Initialize state.
    x_ << meas_package.raw_measurements_(0),meas_package.raw_measurements_(1),0,0,0;

  }

  return;

}